

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynDoWhile * ParseDoWhile(ParseContext *ctx)

{
  Lexeme *begin;
  int iVar1;
  undefined4 extraout_var;
  SynBase *pSVar2;
  undefined4 extraout_var_00;
  SynDoWhile *this;
  IntrusiveList<SynBase> local_48;
  SynBase *local_38;
  SynBase *pSStack_30;
  undefined4 extraout_var_01;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_do) {
    ctx->currentLexeme = begin + 1;
    local_48 = (IntrusiveList<SynBase>)ZEXT816(0);
    if (begin[1].type == lex_ofigure) {
      ctx->currentLexeme = begin + 2;
      local_48 = ParseExpressions(ctx);
      anon_unknown.dwarf_15b62::CheckConsume(ctx,lex_cfigure,"ERROR: closing \'}\' not found");
    }
    else {
      pSVar2 = ParseExpression(ctx);
      if (pSVar2 == (SynBase *)0x0) {
        anon_unknown.dwarf_15b62::Report
                  (ctx,ctx->currentLexeme,"ERROR: expression expected after \'do\'");
        iVar1 = (*ctx->allocator->_vptr_Allocator[2])();
        pSVar2 = (SynBase *)CONCAT44(extraout_var,iVar1);
        SynBase::SynBase(pSVar2,0,ctx->currentLexeme,ctx->currentLexeme);
        pSVar2->_vptr_SynBase = (_func_int **)&PTR__SynBase_00222408;
      }
      IntrusiveList<SynBase>::push_back(&local_48,pSVar2);
    }
    anon_unknown.dwarf_15b62::CheckConsume
              (ctx,lex_while,"ERROR: \'while\' expected after \'do\' statement");
    anon_unknown.dwarf_15b62::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' not found after \'while\'");
    pSVar2 = ParseAssignment(ctx);
    if (pSVar2 == (SynBase *)0x0) {
      anon_unknown.dwarf_15b62::Report
                (ctx,ctx->currentLexeme,"ERROR: expression expected after \'while(\'");
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])();
      pSVar2 = (SynBase *)CONCAT44(extraout_var_00,iVar1);
      SynBase::SynBase(pSVar2,0,ctx->currentLexeme,ctx->currentLexeme);
      pSVar2->_vptr_SynBase = (_func_int **)&PTR__SynBase_00222408;
    }
    anon_unknown.dwarf_15b62::CheckConsume
              (ctx,lex_cparen,
               "ERROR: closing \')\' not found after expression in \'while\' statement");
    anon_unknown.dwarf_15b62::CheckConsume
              (ctx,lex_semicolon,"ERROR: while(...) should be followed by \';\'");
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
    this = (SynDoWhile *)CONCAT44(extraout_var_01,iVar1);
    if (ctx->currentLexeme <= ctx->firstLexeme) {
      __assert_fail("currentLexeme > firstLexeme",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0x19c,"Lexeme *ParseContext::Previous()");
    }
    local_38 = local_48.head;
    pSStack_30 = local_48.tail;
    SynBase::SynBase((SynBase *)this,0x2c,begin,ctx->currentLexeme + -1);
    (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_00222e88;
    (this->expressions).head = local_38;
    (this->expressions).tail = pSStack_30;
    this->condition = pSVar2;
  }
  else {
    this = (SynDoWhile *)0x0;
  }
  return this;
}

Assistant:

SynDoWhile* ParseDoWhile(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_do))
	{
		IntrusiveList<SynBase> expressions;

		if(ctx.Consume(lex_ofigure))
		{
			expressions = ParseExpressions(ctx);

			CheckConsume(ctx, lex_cfigure, "ERROR: closing '}' not found");
		}
		else if(SynBase *body = ParseExpression(ctx))
		{
			expressions.push_back(body);
		}
		else
		{
			Report(ctx, ctx.Current(), "ERROR: expression expected after 'do'");

			expressions.push_back(new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current()));
		}

		CheckConsume(ctx, lex_while, "ERROR: 'while' expected after 'do' statement");

		CheckConsume(ctx, lex_oparen, "ERROR: '(' not found after 'while'");

		SynBase *condition = ParseAssignment(ctx);

		if(!condition)
		{
			Report(ctx, ctx.Current(), "ERROR: expression expected after 'while('");

			condition = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: closing ')' not found after expression in 'while' statement");

		CheckConsume(ctx, lex_semicolon, "ERROR: while(...) should be followed by ';'");

		return new (ctx.get<SynDoWhile>()) SynDoWhile(start, ctx.Previous(), expressions, condition);
	}

	return NULL;
}